

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SoundConfigTab.cpp
# Opt level: O2

void __thiscall
SoundConfigTab::apiChanged<AudioEnumerator>
          (SoundConfigTab *this,AudioEnumerator *enumerator,DeviceGroup *group,int index)

{
  QLabel *pQVar1;
  bool bVar2;
  QSignalBlocker blocker;
  QSignalBlocker local_30;
  
  QSignalBlocker::QSignalBlocker(&local_30,(QObject *)group->mDeviceCombo);
  AudioEnumerator::populate(enumerator,index);
  DeviceGroup::populateDevices<AudioEnumerator>(group,enumerator);
  QComboBox::setCurrentIndex((int)group->mDeviceCombo);
  pQVar1 = group->mErrorLabel;
  bVar2 = AudioEnumerator::backendIsAvailable(enumerator,index);
  (**(code **)(*(long *)pQVar1 + 0x68))(pQVar1,!bVar2);
  ConfigTab::setDirty<(Config::Category)1>(&this->super_ConfigTab);
  QSignalBlocker::~QSignalBlocker(&local_30);
  return;
}

Assistant:

void SoundConfigTab::apiChanged(Enumerator &enumerator, DeviceGroup *group, int index) {
    QSignalBlocker blocker(group->mDeviceCombo);
    enumerator.populate(index);
    group->populateDevices(enumerator);
    group->mDeviceCombo->setCurrentIndex(0); // default

    group->mErrorLabel->setVisible(!enumerator.backendIsAvailable(index));

    setDirtyFromEnumerator<Enumerator>();

}